

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::emit_resources(CompilerMSL *this)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  ExecutionModel EVar1;
  SPIREntryPoint *pSVar2;
  size_type sVar3;
  char *topology;
  char *per_primitive;
  
  declare_constant_arrays(this);
  emit_interface_block(this,(this->stage_out_var_id).id);
  emit_interface_block(this,(this->patch_stage_out_var_id).id);
  emit_interface_block(this,(this->stage_in_var_id).id);
  emit_interface_block(this,(this->patch_stage_in_var_id).id);
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  if (EVar1 == ExecutionModelMeshEXT) {
    pSVar2 = Compiler::get_entry_point((Compiler *)this);
    topology = "";
    per_primitive = (char *)CONCAT44(per_primitive._4_4_,0x14b2);
    this_00 = &(pSVar2->flags).higher;
    sVar3 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_00->_M_h,(key_type *)&per_primitive);
    if (sVar3 == 0) {
      per_primitive = (char *)CONCAT44(per_primitive._4_4_,0x1495);
      sVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,(key_type *)&per_primitive);
      if (sVar3 == 0) {
        if (((pSVar2->flags).lower & 0x8000000) != 0) {
          topology = "topology::point";
        }
      }
      else {
        topology = "topology::line";
      }
    }
    else {
      topology = "topology::triangle";
    }
    per_primitive = "spvPerPrimitive";
    if ((this->mesh_out_per_primitive).id == 0) {
      per_primitive = "void";
    }
    CompilerGLSL::
    statement<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [24])"using spvMesh_t = mesh<",
               (char (*) [15])"spvPerVertex, ",&per_primitive,(char (*) [3])0x2d38e3,
               &pSVar2->output_vertices,(char (*) [3])0x2d38e3,&pSVar2->output_primitives,
               (char (*) [3])0x2d38e3,&topology,(char (*) [3])">;");
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2b1c7b);
  }
  return;
}

Assistant:

void CompilerMSL::emit_resources()
{
	declare_constant_arrays();

	// Emit the special [[stage_in]] and [[stage_out]] interface blocks which we created.
	emit_interface_block(stage_out_var_id);
	emit_interface_block(patch_stage_out_var_id);
	emit_interface_block(stage_in_var_id);
	emit_interface_block(patch_stage_in_var_id);

	if (get_execution_model() == ExecutionModelMeshEXT)
	{
		auto &execution = get_entry_point();
		const char *topology = "";
		if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
			topology = "topology::triangle";
		else if (execution.flags.get(ExecutionModeOutputLinesEXT))
			topology = "topology::line";
		else if (execution.flags.get(ExecutionModeOutputPoints))
			topology = "topology::point";

		const char *per_primitive = mesh_out_per_primitive ? "spvPerPrimitive" : "void";
		statement("using spvMesh_t = mesh<", "spvPerVertex, ", per_primitive, ", ", execution.output_vertices, ", ",
		          execution.output_primitives, ", ", topology, ">;");
		statement("");
	}
}